

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_v3.cc
# Opt level: O2

int X509_EXTENSION_set_data(X509_EXTENSION *ex,ASN1_OCTET_STRING *data)

{
  int iVar1;
  
  if (ex != (X509_EXTENSION *)0x0) {
    iVar1 = ASN1_OCTET_STRING_set(ex->value,data->data,data->length);
    return (uint)(iVar1 != 0);
  }
  return 0;
}

Assistant:

int X509_EXTENSION_set_data(X509_EXTENSION *ex, const ASN1_OCTET_STRING *data) {
  int i;

  if (ex == NULL) {
    return 0;
  }
  i = ASN1_OCTET_STRING_set(ex->value, data->data, data->length);
  if (!i) {
    return 0;
  }
  return 1;
}